

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O0

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
          (xr_reader *this,vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *n,
          vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *container)

{
  vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *this_00;
  reference link;
  value_type local_30;
  vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *local_28;
  vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *container_local;
  size_t n_local;
  xr_reader *this_local;
  
  local_28 = container;
  container_local = n;
  n_local = (size_t)this;
  std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::reserve
            (container,(size_type)n);
  while (this_00 = local_28,
        container_local != (vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *)0x0) {
    container_local =
         (vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *)
         ((long)&container_local[-1].
                 super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
    memset(&local_30,0,8);
    std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::push_back(this_00,&local_30)
    ;
    link = std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::back(local_28);
    way_link_io::operator()((way_link_io *)((long)&this_local + 7),link,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}